

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void __thiscall
crnlib::vector<crnlib::mip_level_*>::vector
          (vector<crnlib::mip_level_*> *this,uint n,mip_level **init)

{
  mip_level **in_RDX;
  uint in_ESI;
  vector<crnlib::mip_level_*> *in_RDI;
  bool in_stack_ffffffffffffffda;
  bool in_stack_ffffffffffffffdb;
  uint in_stack_ffffffffffffffdc;
  
  in_RDI->m_p = (mip_level **)0x0;
  in_RDI->m_size = 0;
  in_RDI->m_capacity = 0;
  increase_capacity(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffdb,
                    in_stack_ffffffffffffffda);
  helpers::construct_array<crnlib::mip_level*,crnlib::mip_level*>(in_RDI->m_p,in_ESI,in_RDX);
  in_RDI->m_size = in_ESI;
  return;
}

Assistant:

inline vector(uint n, const T& init)
      : m_p(NULL),
        m_size(0),
        m_capacity(0) {
    increase_capacity(n, false);
    helpers::construct_array(m_p, n, init);
    m_size = n;
  }